

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

ON_NurbsCage * __thiscall ON_NurbsCage::operator=(ON_NurbsCage *this,ON_NurbsCage *src)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  int k;
  int i;
  int iVar4;
  int j;
  double *pdVar5;
  
  if (this != src) {
    ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
    bVar1 = Create(this,src->m_dim,src->m_is_rat,src->m_order[0],src->m_order[1],src->m_order[2],
                   src->m_cv_count[0],src->m_cv_count[1],src->m_cv_count[2]);
    if (bVar1) {
      if ((((1 < this->m_order[0]) && (this->m_order[0] <= this->m_cv_count[0])) &&
          (pdVar5 = this->m_knot[0], pdVar5 != (double *)0x0)) &&
         (pdVar3 = src->m_knot[0], pdVar3 != (double *)0x0)) {
        iVar2 = KnotCount(this,0);
        memcpy(pdVar5,pdVar3,(long)iVar2 << 3);
      }
      if (((1 < this->m_order[1]) && (this->m_order[1] <= this->m_cv_count[1])) &&
         ((pdVar5 = this->m_knot[1], pdVar5 != (double *)0x0 &&
          (pdVar3 = src->m_knot[1], pdVar3 != (double *)0x0)))) {
        iVar2 = KnotCount(this,1);
        memcpy(pdVar5,pdVar3,(long)iVar2 << 3);
      }
      if (((1 < this->m_order[2]) && (this->m_order[2] <= this->m_cv_count[2])) &&
         ((pdVar5 = this->m_knot[2], pdVar5 != (double *)0x0 &&
          (pdVar3 = src->m_knot[2], pdVar3 != (double *)0x0)))) {
        iVar2 = KnotCount(this,2);
        memcpy(pdVar5,pdVar3,(long)iVar2 << 3);
      }
      pdVar5 = this->m_cv;
      if ((((pdVar5 != (double *)0x0) && (src->m_cv != (double *)0x0)) && (0 < this->m_cv_stride[0])
          ) && ((0 < this->m_cv_stride[1] && (0 < this->m_cv_stride[2])))) {
        iVar4 = (uint)(byte)(0 < this->m_dim & this->m_is_rat) + this->m_dim;
        iVar2 = iVar4 * 8;
        if ((this->m_cv_stride[0] == src->m_cv_stride[0]) &&
           ((this->m_cv_stride[1] == src->m_cv_stride[1] &&
            (this->m_cv_stride[2] == src->m_cv_stride[2])))) {
          memcpy(pdVar5,src->m_cv,
                 (long)(iVar2 * this->m_cv_count[0] * this->m_cv_count[1] * this->m_cv_count[2]));
        }
        else {
          for (i = 0; i < this->m_cv_count[0]; i = i + 1) {
            for (j = 0; j < this->m_cv_count[1]; j = j + 1) {
              for (k = 0; k < this->m_cv_count[2]; k = k + 1) {
                pdVar3 = CV(src,i,j,k);
                memcpy(pdVar5,pdVar3,(long)iVar2);
                pdVar5 = pdVar5 + iVar4;
              }
            }
          }
        }
      }
    }
    else {
      Destroy(this);
    }
  }
  return this;
}

Assistant:

ON_NurbsCage& ON_NurbsCage::operator=(const ON_NurbsCage& src)
{
  if ( this != &src ) 
  {
    ON_Geometry::operator=(src);
    if ( Create( src.m_dim, src.m_is_rat, 
         src.m_order[0], src.m_order[1], src.m_order[2],
         src.m_cv_count[0], src.m_cv_count[1], src.m_cv_count[2]
         ) )
    {
      if ( m_order[0] >= 2 && m_cv_count[0] >= m_order[0] && m_knot[0] && src.m_knot[0] )
        memcpy( m_knot[0], src.m_knot[0], KnotCount(0)*sizeof(m_knot[0][0]));
      if ( m_order[1] >= 2 && m_cv_count[1] >= m_order[1] && m_knot[1] && src.m_knot[1]  )
        memcpy( m_knot[1], src.m_knot[1], KnotCount(1)*sizeof(m_knot[1][0]));
      if ( m_order[2] >= 2 && m_cv_count[2] >= m_order[2] && m_knot[2] && src.m_knot[2]  )
        memcpy( m_knot[2], src.m_knot[2], KnotCount(2)*sizeof(m_knot[2][0]));

      if ( m_cv && src.m_cv && m_cv_stride[0] > 0 && m_cv_stride[1] > 0 && m_cv_stride[2] > 0 )
      {
        const int cv_dim = CVSize();
        const int sizeofcv = cv_dim*sizeof(m_cv[0]);
        if (    m_cv_stride[0] == src.m_cv_stride[0] 
            && m_cv_stride[1] == src.m_cv_stride[1]
            && m_cv_stride[2] == src.m_cv_stride[2] )
        {
          memcpy(m_cv,src.m_cv,m_cv_count[0]*m_cv_count[1]*m_cv_count[2]*sizeofcv);
        }
        else
        {
          int i, j, k;
          double* cv = m_cv;
          for ( i = 0; i < m_cv_count[0]; i++ ) 
          for ( j = 0; j < m_cv_count[1]; j++ ) 
          for ( k = 0; k < m_cv_count[2]; k++ ) 
          {
            memcpy( cv, src.CV(i,j,k), sizeofcv );
            cv += cv_dim;
          }
        }
      }
    }
    else 
    {
      Destroy();
    }
  }
  return *this;
}